

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_entity_indexing.cc
# Opt level: O3

void lf::mesh::test_utils::checkEntityIndexing(Mesh *mesh)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long extraout_RDX;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  char *in_R9;
  ulong uVar7;
  glb_idx_t current_idx;
  size_type no_of_entities;
  vector<int,_std::allocator<int>_> idx_use;
  uint local_b4;
  int local_b0;
  undefined4 uStack_ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  AssertHelper local_a0;
  uint local_94;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  ulong local_70;
  uint local_64;
  vector<int,_std::allocator<int>_> local_60;
  ulong local_48;
  Mesh *local_40;
  AssertHelper local_38;
  long lVar3;
  
  local_64 = (**mesh->_vptr_Mesh)();
  uVar7 = 0;
  local_40 = mesh;
  do {
    local_94 = (*mesh->_vptr_Mesh[3])(mesh,uVar7);
    local_90._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_60,(ulong)local_94,(value_type_conflict2 *)local_90,
               (allocator_type *)&local_b0);
    local_70 = uVar7;
    iVar1 = (*mesh->_vptr_Mesh[2])(mesh,uVar7);
    if (extraout_RDX != 0) {
      local_48 = local_70 & 0xffffffff;
      lVar5 = 0;
      do {
        local_b4 = (*mesh->_vptr_Mesh[5])
                             (mesh,*(undefined8 *)(CONCAT44(extraout_var,iVar1) + lVar5));
        testing::internal::CmpHelperLT<unsigned_int,unsigned_int>
                  ((internal *)local_90,"current_idx","no_of_entities",&local_b4,&local_94);
        if (local_90[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(CONCAT44(uStack_ac,local_b0) + 0x10),"Index ",6);
          std::ostream::_M_insert<unsigned_long>(CONCAT44(uStack_ac,local_b0) + 0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(CONCAT44(uStack_ac,local_b0) + 0x10)," out of range",0xd);
          pcVar6 = "";
          if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = (local_88->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/test_utils/check_entity_indexing.cc"
                     ,0x16,pcVar6);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if ((long *)CONCAT44(uStack_ac,local_b0) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(uStack_ac,local_b0) + 8))();
          }
        }
        if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_88,local_88);
        }
        local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[local_b4] =
             local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[local_b4] + 1;
        iVar2 = (*mesh->_vptr_Mesh[6])(mesh,local_70,(ulong)local_b4);
        lVar3 = CONCAT44(extraout_var_00,iVar2);
        local_b0 = CONCAT31(local_b0._1_3_,lVar3 != 0);
        local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (lVar3 == 0) {
          testing::Message::Message((Message *)&local_a0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_a0.data_)->line,"Invalid pointer to entity ",0x1a);
          std::ostream::operator<<(&(local_a0.data_)->line,local_b4);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_90,(internal *)&local_b0,(AssertionResult *)"e_ptr","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/test_utils/check_entity_indexing.cc"
                     ,0x1c,(char *)CONCAT44(local_90._4_4_,local_90._0_4_));
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_90._4_4_,local_90._0_4_) != &local_80) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_90._4_4_,local_90._0_4_),
                            local_80._M_allocated_capacity + 1);
          }
          if (local_a0.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
          mesh = local_40;
          if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_a8,local_a8);
            mesh = local_40;
          }
        }
        else {
          local_b0 = (*mesh->_vptr_Mesh[5])(mesh,lVar3);
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                    ((internal *)local_90,"current_idx","mesh.Index(*e_ptr)",&local_b4,
                     (uint *)&local_b0);
          if (local_90[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(CONCAT44(uStack_ac,local_b0) + 0x10),"Index mismatch for codim ",
                       0x19);
            std::ostream::_M_insert<unsigned_long>(CONCAT44(uStack_ac,local_b0) + 0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(CONCAT44(uStack_ac,local_b0) + 0x10),", index ",8);
            std::ostream::_M_insert<unsigned_long>(CONCAT44(uStack_ac,local_b0) + 0x10);
            pcVar6 = "";
            if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar6 = (local_88->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_a0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/test_utils/check_entity_indexing.cc"
                       ,0x1f,pcVar6);
            testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
            testing::internal::AssertHelper::~AssertHelper(&local_a0);
            if ((long *)CONCAT44(uStack_ac,local_b0) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(uStack_ac,local_b0) + 8))();
            }
          }
          if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_88,local_88);
          }
        }
        lVar5 = lVar5 + 8;
      } while (extraout_RDX << 3 != lVar5);
    }
    if (local_94 != 0) {
      uVar7 = 0;
      do {
        local_b0 = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_90,"idx_use[idx_cnt]","1",
                   local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar7,&local_b0);
        if (local_90[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(CONCAT44(uStack_ac,local_b0) + 0x10),"Index ",6);
          std::ostream::_M_insert<unsigned_long>(CONCAT44(uStack_ac,local_b0) + 0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(CONCAT44(uStack_ac,local_b0) + 0x10)," occurs ",8);
          std::ostream::operator<<
                    ((void *)(CONCAT44(uStack_ac,local_b0) + 0x10),
                     local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7]);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(CONCAT44(uStack_ac,local_b0) + 0x10)," times!",7);
          pcVar6 = "";
          if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = (local_88->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/test_utils/check_entity_indexing.cc"
                     ,0x29,pcVar6);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if ((long *)CONCAT44(uStack_ac,local_b0) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(uStack_ac,local_b0) + 8))();
          }
        }
        if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_88,local_88);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < local_94);
    }
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar4 = (int)local_70 + 1;
    uVar7 = (ulong)uVar4;
  } while (uVar4 <= local_64);
  return;
}

Assistant:

void checkEntityIndexing(const Mesh& mesh) {
  using size_type = lf::base::size_type;  // type for indices
  const auto dim_mesh = mesh.DimMesh();   // dimension of meshed manifold
  // Now run over all co-dimensions to check indexing
  for (size_type co_dim = 0; co_dim <= dim_mesh; ++co_dim) {
    // Number of entities of current co-dimension
    const auto no_of_entities = mesh.NumEntities(co_dim);
    // counting array for occurrences of an index
    std::vector<int> idx_use(no_of_entities, 0);
    // Traverse all entities of a given co-dimension
    for (const Entity* e : mesh.Entities(co_dim)) {
      // Fetch index of current entity
      const lf::base::glb_idx_t current_idx = mesh.Index(*e);
      // Check whether index is in range and, if so, count it
      EXPECT_LT(current_idx, no_of_entities)
          << "Index " << current_idx << " out of range";
      idx_use[current_idx]++;

      // Check consistency of indexing
      const lf::mesh::Entity* e_ptr = mesh.EntityByIndex(co_dim, current_idx);
      EXPECT_TRUE(e_ptr) << "Invalid pointer to entity "
                         << static_cast<int>(current_idx);
      if (e_ptr != nullptr) {
        EXPECT_EQ(current_idx, mesh.Index(*e_ptr))
            << "Index mismatch for codim " << co_dim << ", index "
            << current_idx;
      }
    }  // end loop over entities

    // Indices should occur only once. This means that the counting array
    // should contain 1 in every component.
    for (size_type idx_cnt = 0; idx_cnt < no_of_entities; ++idx_cnt) {
      // NOLINTNEXTLINE
      EXPECT_EQ(idx_use[idx_cnt], 1)
          << "Index " << idx_cnt << " occurs " << idx_use[idx_cnt] << " times!";
    }
  }  // end for
}